

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

Instr * LowererMD::ChangeToWriteBarrierAssign(Instr *assignInstr,Func *func)

{
  code *pcVar1;
  IRType IVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Opnd *pOVar6;
  Func *this;
  ThreadContextInfo *pTVar7;
  IndirOpnd *this_00;
  MemRefOpnd *this_01;
  char *addr;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 *puVar8;
  Instr *local_40;
  Instr *instr;
  bool isPossibleBarrieredDest;
  void *destAddr;
  ThreadContextInfo *threadContextInfo;
  Opnd *dest;
  Func *func_local;
  Instr *assignInstr_local;
  
  pOVar6 = IR::Instr::GetDst(assignInstr);
  this = Func::GetTopFunc(func);
  pTVar7 = Func::GetThreadContextInfo(this);
  bVar4 = false;
  IVar2 = IR::Opnd::GetType(pOVar6);
  if (TySize[IVar2] == 8) {
    bVar3 = IR::Opnd::IsIndirOpnd(pOVar6);
    if (bVar3) {
      this_00 = IR::Opnd::AsIndirOpnd(pOVar6);
      bVar4 = IR::IndirOpnd::HasAddrKind(this_00);
      if (bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0xfdc,"(!dest->AsIndirOpnd()->HasAddrKind())",
                           "!dest->AsIndirOpnd()->HasAddrKind()");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      bVar4 = true;
    }
    else {
      bVar3 = IR::Opnd::IsMemRefOpnd(pOVar6);
      if (bVar3) {
        this_01 = IR::Opnd::AsMemRefOpnd(pOVar6);
        addr = (char *)IR::MemRefOpnd::GetMemLoc(this_01);
        bVar4 = false;
        if ((addr != (char *)0x0) && (bVar4 = false, ((ulong)addr & 7) == 0)) {
          iVar5 = (*pTVar7->_vptr_ThreadContextInfo[5])();
          bVar4 = false;
          if (addr != (char *)CONCAT44(extraout_var,iVar5)) {
            iVar5 = (*pTVar7->_vptr_ThreadContextInfo[4])();
            bVar4 = false;
            if (addr != (char *)CONCAT44(extraout_var_00,iVar5)) {
              iVar5 = (*pTVar7->_vptr_ThreadContextInfo[9])();
              bVar4 = addr != (char *)CONCAT44(extraout_var_01,iVar5);
            }
          }
        }
        if ((bVar4) && (bVar3 = Memory::Recycler::WBCheckIsRecyclerAddress(addr), !bVar3)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                             ,0xfeb,"(Recycler::WBCheckIsRecyclerAddress((char*)destAddr))",
                             "Recycler::WBCheckIsRecyclerAddress((char*)destAddr)");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
      }
    }
  }
  local_40 = ChangeToAssignNoBarrierCheck(assignInstr);
  if ((bVar4) && (assignInstr->m_opcode == MOV)) {
    pOVar6 = IR::Instr::GetSrc1(assignInstr);
    bVar4 = IR::Opnd::IsWriteBarrierTriggerableValue(pOVar6);
    if (bVar4) {
      local_40 = GenerateWriteBarrier(assignInstr);
    }
  }
  return local_40;
}

Assistant:

IR::Instr *
LowererMD::ChangeToWriteBarrierAssign(IR::Instr * assignInstr, const Func* func)
{
#ifdef RECYCLER_WRITE_BARRIER_JIT
    IR::Opnd* dest = assignInstr->GetDst();

    auto threadContextInfo = func->GetTopFunc()->GetThreadContextInfo();
    void* destAddr = nullptr;
    bool isPossibleBarrieredDest = false;

    if (TySize[dest->GetType()] == sizeof(void*))
    {
        if (dest->IsIndirOpnd())
        {
            Assert(!dest->AsIndirOpnd()->HasAddrKind());
            isPossibleBarrieredDest = true;
        }
        else if (dest->IsMemRefOpnd())
        {
            // looks all thread context field access are from MemRefOpnd
            destAddr = (void*)dest->AsMemRefOpnd()->GetMemLoc();
            isPossibleBarrieredDest = destAddr != nullptr
                && ((intptr_t)destAddr % sizeof(void*)) == 0
                && destAddr != (void*)threadContextInfo->GetImplicitCallFlagsAddr()
                && destAddr != (void*)threadContextInfo->GetDisableImplicitFlagsAddr()
                && destAddr != (void*)threadContextInfo->GetBailOutRegisterSaveSpaceAddr();

            if (isPossibleBarrieredDest)
            {
                Assert(Recycler::WBCheckIsRecyclerAddress((char*)destAddr));
            }
        }
    }
#endif

    IR::Instr * instr = ChangeToAssignNoBarrierCheck(assignInstr);

    // Now insert write barrier if necessary
#ifdef RECYCLER_WRITE_BARRIER_JIT
    if (isPossibleBarrieredDest
        && assignInstr->m_opcode == Js::OpCode::MOV // ignore SSE instructions like MOVSD
        && assignInstr->GetSrc1()->IsWriteBarrierTriggerableValue())
    {
        instr = LowererMD::GenerateWriteBarrier(assignInstr);
    }
#endif

    return instr;
}